

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_loadDict(LZ4_stream_t *LZ4_dict,char *dictionary,int dictSize)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  reg_t rVar4;
  BYTE *base;
  BYTE *dictEnd;
  BYTE *p;
  tableType_t tableType;
  LZ4_stream_t_internal *dict;
  int dictSize_local;
  char *dictionary_local;
  LZ4_stream_t *LZ4_dict_local;
  U32 h;
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  uint local_18;
  
  pcVar2 = dictionary + dictSize;
  LZ4_resetStream(LZ4_dict);
  (LZ4_dict->internal_donotuse).currentOffset =
       (LZ4_dict->internal_donotuse).currentOffset + 0x10000;
  if (dictSize < 8) {
    LZ4_dict_local._0_4_ = 0;
  }
  else {
    dictEnd = (BYTE *)dictionary;
    if (0x10000 < (long)pcVar2 - (long)dictionary) {
      dictEnd = (BYTE *)(pcVar2 + -0x10000);
    }
    lVar3 = (long)pcVar2 - (ulong)(LZ4_dict->internal_donotuse).currentOffset;
    (LZ4_dict->internal_donotuse).dictionary = dictEnd;
    (LZ4_dict->internal_donotuse).dictSize = (int)pcVar2 - (int)dictEnd;
    (LZ4_dict->internal_donotuse).tableType = 2;
    for (; dictEnd <= pcVar2 + -8; dictEnd = dictEnd + 3) {
      rVar4 = LZ4_read_ARCH(dictEnd);
      uVar1 = LZ4_isLittleEndian();
      if (uVar1 == 0) {
        local_18 = (uint)((rVar4 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
      }
      else {
        local_18 = (uint)(rVar4 * -0x30e4432345000000 >> 0x20);
      }
      local_18 = local_18 >> 0x14;
      switch(0x13e44c) {
      case 0:
        break;
      case 1:
        LZ4_dict->table[local_18] = (unsigned_long_long)dictEnd;
        break;
      case 2:
        *(int *)((long)LZ4_dict + (ulong)local_18 * 4) = (int)dictEnd - (int)lVar3;
        break;
      case 3:
        *(short *)((long)LZ4_dict + (ulong)local_18 * 2) = (short)dictEnd - (short)lVar3;
      }
    }
    LZ4_dict_local._0_4_ = (LZ4_dict->internal_donotuse).dictSize;
  }
  return (uint32_t)LZ4_dict_local;
}

Assistant:

int LZ4_loadDict (LZ4_stream_t* LZ4_dict, const char* dictionary, int dictSize)
{
    LZ4_stream_t_internal* dict = &LZ4_dict->internal_donotuse;
    const tableType_t tableType = byU32;
    const BYTE* p = (const BYTE*)dictionary;
    const BYTE* const dictEnd = p + dictSize;
    const BYTE* base;

    DEBUGLOG(4, "LZ4_loadDict (%i bytes from %p into %p)", dictSize, dictionary, LZ4_dict);

    /* It's necessary to reset the context,
     * and not just continue it with prepareTable()
     * to avoid any risk of generating overflowing matchIndex
     * when compressing using this dictionary */
    LZ4_resetStream(LZ4_dict);

    /* We always increment the offset by 64 KB, since, if the dict is longer,
     * we truncate it to the last 64k, and if it's shorter, we still want to
     * advance by a whole window length so we can provide the guarantee that
     * there are only valid offsets in the window, which allows an optimization
     * in LZ4_compress_fast_continue() where it uses noDictIssue even when the
     * dictionary isn't a full 64k. */
    dict->currentOffset += 64 KB;

    if (dictSize < (int)HASH_UNIT) {
        return 0;
    }

    if ((dictEnd - p) > 64 KB) p = dictEnd - 64 KB;
    base = dictEnd - dict->currentOffset;
    dict->dictionary = p;
    dict->dictSize = (U32)(dictEnd - p);
    dict->tableType = tableType;

    while (p <= dictEnd-HASH_UNIT) {
        LZ4_putPosition(p, dict->hashTable, tableType, base);
        p+=3;
    }

    return (int)dict->dictSize;
}